

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMisc.c
# Opt level: O1

void Extra_NpnTest2(void)

{
  int *pComp;
  int *pPerm;
  word t;
  word tMin;
  word local_20;
  word local_18;
  
  local_20 = 0xa2222aaa08888000;
  pComp = Extra_GreyCodeSchedule(6);
  pPerm = Extra_PermSchedule(6);
  local_18 = Extra_Truth6MinimumExact(local_20,pComp,pPerm);
  if (pPerm != (int *)0x0) {
    free(pPerm);
  }
  if (pComp != (int *)0x0) {
    free(pComp);
  }
  Extra_PrintHex(_stdout,(uint *)&local_20,6);
  putchar(10);
  Extra_PrintHex(_stdout,(uint *)&local_18,6);
  putchar(10);
  return;
}

Assistant:

void Extra_NpnTest2()
{
    int * pComp, * pPerm;
    word tMin, t = ABC_CONST(0xa2222aaa08888000);
    pComp = Extra_GreyCodeSchedule( 6 );
    pPerm = Extra_PermSchedule( 6 );
    tMin  = Extra_Truth6MinimumExact( t, pComp, pPerm );
    ABC_FREE( pPerm );
    ABC_FREE( pComp );

    Extra_PrintHex( stdout, (unsigned *)&t,    6 ), printf( "\n" );
    Extra_PrintHex( stdout, (unsigned *)&tMin, 6 ), printf( "\n" );
}